

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg_00;
  bool bVar1;
  MessageType MVar2;
  size_t sVar3;
  Descriptor *desc;
  Status *_status;
  size_t idx;
  char *bytes;
  string_view sVar4;
  Metadata MVar5;
  string_view name;
  bool first;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *local_e8;
  StatusOr<const_google::protobuf::Message_*> inner;
  char *pcStack_d0;
  _Head_base<0UL,_unsigned_long,_false> local_a0;
  _Head_base<0UL,_long,_false> local_98;
  undefined1 local_90 [48];
  AlphaNum local_60;
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"[",1);
  writer->indent_ = writer->indent_ + 1;
  local_e8 = msg;
  sVar3 = UnparseProto2Descriptor::GetSize(field,msg);
  first = true;
  idx = 0;
  do {
    if (sVar3 == idx) {
      writer->indent_ = writer->indent_ + -1;
      if (first == false) {
        JsonWriter::NewLine(writer);
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"]",1);
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    sVar4 = Proto2Descriptor::FieldTypeName(field);
    name._M_str = sVar4._M_str;
    name._M_len = (size_t)name._M_str;
    MVar2 = ClassifyMessage((json_internal *)sVar4._M_len,name);
    if (MVar2 == kValue) {
      desc = FieldDescriptor::message_type(field);
      UnparseProto2Descriptor::GetMessage((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
      absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
        EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&inner);
        bVar1 = IsEmpty<google::protobuf::json_internal::UnparseProto2Descriptor>
                          ((Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)
                           CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                    field_1._4_4_,
                                    inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                    field_1._0_4_),desc);
        *(undefined8 *)this = 1;
      }
      else {
        bVar1 = false;
      }
      absl::lts_20240722::Status::~Status((Status *)&inner);
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
      absl::lts_20240722::Status::~Status((Status *)this);
      if (bVar1 == false) goto LAB_0029d47a;
    }
    else {
LAB_0029d47a:
      JsonWriter::WriteComma(writer,&first);
      JsonWriter::NewLine(writer);
      switch(field->type_) {
      case '\x01':
        UnparseProto2Descriptor::GetDouble((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                  ((StatusOrData<double> *)&inner);
        JsonWriter::Write(writer,(double)CONCAT44(inner.
                                                  super_StatusOrData<const_google::protobuf::Message_*>
                                                  .field_1._4_4_,
                                                  inner.
                                                  super_StatusOrData<const_google::protobuf::Message_*>
                                                  .field_1._0_4_));
LAB_0029d934:
        absl::lts_20240722::Status::~Status((Status *)&inner);
        *(undefined8 *)this = 1;
        goto LAB_0029d943;
      case '\x02':
        UnparseProto2Descriptor::GetFloat((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<float>::EnsureOk
                    ((StatusOrData<float> *)&inner);
          JsonWriter::Write(writer,(float)inner.
                                          super_StatusOrData<const_google::protobuf::Message_*>.
                                          field_1._0_4_);
          goto LAB_0029d934;
        }
        break;
      case '\x03':
      case '\x10':
      case '\x12':
        UnparseProto2Descriptor::GetInt64((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          if ((writer->options_).unquote_int64_if_possible == true) {
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      ((StatusOrData<long> *)&inner);
            bVar1 = RoundTripsThroughDouble<long>
                              (CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                        field_1._4_4_,
                                        inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                        field_1._0_4_));
            if (bVar1) {
              absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                        ((StatusOrData<long> *)&inner);
              JsonWriter::Write(writer,CONCAT44(inner.
                                                super_StatusOrData<const_google::protobuf::Message_*>
                                                .field_1._4_4_,
                                                inner.
                                                super_StatusOrData<const_google::protobuf::Message_*>
                                                .field_1._0_4_));
              goto LAB_0029d934;
            }
          }
          absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                    ((StatusOrData<long> *)&inner);
          local_98._M_head_impl =
               CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._4_4_,
                        inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_4_);
          JsonWriter::Write<long>(writer,(Quoted<long> *)&local_98);
          goto LAB_0029d934;
        }
        break;
      case '\x04':
      case '\x06':
        UnparseProto2Descriptor::GetUInt64((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          if ((writer->options_).unquote_int64_if_possible == true) {
            absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                      ((StatusOrData<unsigned_long> *)&inner);
            bVar1 = RoundTripsThroughDouble<unsigned_long>
                              (CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                        field_1._4_4_,
                                        inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                        field_1._0_4_));
            if (bVar1) {
              absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                        ((StatusOrData<unsigned_long> *)&inner);
              JsonWriter::Write(writer,CONCAT44(inner.
                                                super_StatusOrData<const_google::protobuf::Message_*>
                                                .field_1._4_4_,
                                                inner.
                                                super_StatusOrData<const_google::protobuf::Message_*>
                                                .field_1._0_4_));
              goto LAB_0029d934;
            }
          }
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                    ((StatusOrData<unsigned_long> *)&inner);
          local_a0._M_head_impl =
               CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._4_4_,
                        inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_4_);
          JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_a0);
          goto LAB_0029d934;
        }
        break;
      case '\x05':
      case '\x0f':
      case '\x11':
        UnparseProto2Descriptor::GetInt32((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                    ((StatusOrData<int> *)&inner);
          JsonWriter::Write(writer,inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                   field_1._0_4_);
          goto LAB_0029d934;
        }
        break;
      case '\a':
      case '\r':
        UnparseProto2Descriptor::GetUInt32((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::EnsureOk
                    ((StatusOrData<unsigned_int> *)&inner);
          JsonWriter::Write(writer,inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                   field_1._0_4_);
          goto LAB_0029d934;
        }
        break;
      case '\b':
        UnparseProto2Descriptor::GetBool((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
                    ((StatusOrData<bool> *)&inner);
          bytes = "false";
          if ((ulong)(byte)inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_1_
              != 0) {
            bytes = "true";
          }
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,bytes,
                     (ulong)(byte)inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                  field_1._0_1_ ^ 5);
          goto LAB_0029d934;
        }
        break;
      case '\t':
        UnparseProto2Descriptor::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&inner,field,
                   &writer->scratch_buf_,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&inner)
          ;
          local_90._36_4_ =
               inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._4_4_;
          local_90._32_4_ =
               inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_4_;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                    (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            (local_90 + 0x20));
          goto LAB_0029d934;
        }
        break;
      case '\n':
      case '\v':
        UnparseProto2Descriptor::GetMessage((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
          EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&inner);
          msg_00 = (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)
                   CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1.
                            _4_4_,inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                  field_1._0_4_);
          absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
          EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&inner);
          MVar5 = Message::GetMetadata
                            ((Message *)
                             CONCAT44(inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                      field_1._4_4_,
                                      inner.super_StatusOrData<const_google::protobuf::Message_*>.
                                      field_1._0_4_));
          WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                    (this,writer,msg_00,MVar5.descriptor,false);
        }
        break;
      case '\f':
        UnparseProto2Descriptor::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&inner,field,
                   &writer->scratch_buf_,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&inner)
          ;
          sVar4._M_len._4_4_ =
               inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._4_4_;
          sVar4._M_len._0_4_ =
               inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_4_;
          sVar4._M_str = pcStack_d0;
          JsonWriter::WriteBase64(writer,sVar4);
          goto LAB_0029d934;
        }
        break;
      case '\x0e':
        UnparseProto2Descriptor::GetEnumValue((UnparseProto2Descriptor *)&inner,field,local_e8,idx);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&inner);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                    ((StatusOrData<int> *)&inner);
          WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
                    (writer,field,
                     inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_4_,
                     kUnquoted);
          goto LAB_0029d934;
        }
        break;
      default:
        sVar4 = absl::lts_20240722::NullSafeStringView("unsupported field type: ");
        inner.super_StatusOrData<const_google::protobuf::Message_*>.field_0 =
             (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
             sVar4._M_len;
        inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._0_4_ =
             sVar4._M_str._0_4_;
        inner.super_StatusOrData<const_google::protobuf::Message_*>.field_1._4_4_ =
             sVar4._M_str._4_4_;
        absl::lts_20240722::AlphaNum::AlphaNum(&local_60,(uint)field->type_);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_90,(AlphaNum *)&inner);
        absl::lts_20240722::InvalidArgumentError(this,local_90._8_8_,local_90._0_8_);
        std::__cxx11::string::~string((string *)local_90);
        goto LAB_0029d8aa;
      }
      absl::lts_20240722::Status::~Status((Status *)&inner);
LAB_0029d8aa:
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
LAB_0029d943:
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}